

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_repair(char *filename)

{
  uint64_t n;
  uint64_t uVar1;
  mcpl_fileinternal_t *f;
  mcpl_file_t mVar2;
  FILE *__stream;
  int repair_status;
  int local_1c;
  
  local_1c = 1;
  mVar2 = mcpl_actual_open_file(filename,&local_1c);
  n = *(uint64_t *)((long)mVar2.internal + 0x40);
  mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar2.internal);
  if (local_1c == 2) {
    mcpl_error("File must be gunzipped before it can be checked and possibly repaired.");
  }
  if (local_1c == 1) {
    mcpl_error("Input file is indeed broken, but must be gunzipped before it can be repaired.");
  }
  if (local_1c == 0) {
    mcpl_error("File does not appear to be broken.");
  }
  __stream = (FILE *)mcpl_internal_fopen(filename,"r+b");
  if (__stream != (FILE *)0x0) {
    mcpl_update_nparticles((FILE *)__stream,n);
    fclose(__stream);
    local_1c = 1;
    mVar2 = mcpl_actual_open_file(filename,&local_1c);
    uVar1 = *(uint64_t *)((long)mVar2.internal + 0x40);
    mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar2.internal);
    if ((local_1c == 0) && (n == uVar1)) {
      printf("MCPL: Successfully repaired file with %lu particles.\n",n);
      return;
    }
    mcpl_error("Something went wrong while attempting to repair file.");
  }
  mcpl_error("Unable to open file in update mode!");
}

Assistant:

void mcpl_repair(const char * filename)
{
  int repair_status = 1;
  mcpl_file_t f = mcpl_actual_open_file(filename,&repair_status);
  uint64_t nparticles = mcpl_hdr_nparticles(f);
  mcpl_close_file(f);
  if (repair_status==0) {
    mcpl_error("File does not appear to be broken.");
  } else if (repair_status==1) {
    mcpl_error("Input file is indeed broken, but must be gunzipped before it can be repaired.");
  } else if (repair_status==2) {
    mcpl_error("File must be gunzipped before it can be checked and possibly repaired.");
  }
  //Ok, we should repair the file by updating nparticles in the header:
  FILE * fh = mcpl_internal_fopen(filename,"r+b");
  if (!fh)
    mcpl_error("Unable to open file in update mode!");
  mcpl_update_nparticles(fh, nparticles);
  fclose(fh);
  //Verify that we fixed it:
  repair_status = 1;
  f = mcpl_actual_open_file(filename,&repair_status);
  uint64_t nparticles2 = mcpl_hdr_nparticles(f);
  mcpl_close_file(f);
  if (repair_status==0&&nparticles==nparticles2) {
    printf("MCPL: Successfully repaired file with %" PRIu64 " particles.\n",nparticles);
  } else {
    mcpl_error("Something went wrong while attempting to repair file.");
  }
}